

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes,int cut)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  
  pAVar2 = pManMR->pInitNtk;
  if (pAVar2->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum( pInitNtk ) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x3c1,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
  }
  iVar8 = 0;
  pNtk = Abc_NtkAlloc(pAVar2->ntkType,pAVar2->ntkFunc,0);
  do {
    if (vNodes->nSize <= iVar8) {
      pAVar5 = Abc_NtkCreatePo(pNtk);
      plVar6 = (long *)Vec_PtrEntry(pAVar2->vPos,0);
      pAVar3 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8) +
                0x40);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        Abc_ObjAddFanin(pAVar5,pAVar3);
        Abc_NtkAddDummyPoNames(pNtk);
        Abc_NtkAddDummyPiNames(pNtk);
        Abc_NtkCheck(pNtk);
        iVar8 = Abc_NtkMiterSat(pNtk,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        Abc_NtkDelete(pNtk);
        return (int)(iVar8 == 0);
      }
      __assert_fail("pPartNext",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x3e2,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar8);
    uVar1 = *(uint *)&pAVar3->field_0x14;
    *(uint *)&pAVar3->field_0x14 = uVar1 & 0xfff | iVar8 << 0xc;
    if ((uVar1 & 0xf) == 3) {
      __assert_fail("!Abc_ObjIsPo( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x3c8,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
    }
    if ((char)((uVar1 & 0x10) >> 4) == '\0' && iVar8 < cut) {
      pAVar4 = Abc_NtkCreatePi(pNtk);
      (pAVar3->field_6).pCopy = pAVar4;
      pAVar5 = pAVar4;
    }
    else {
      pAVar5 = Abc_NtkDupObj(pNtk,pAVar3,0);
      *(uint *)&pAVar5->field_0x14 =
           *(uint *)&pAVar5->field_0x14 & 0xffffff7f | *(uint *)&pAVar3->field_0x14 & 0x80;
      for (lVar7 = 0; lVar7 < (pAVar3->vFanins).nSize; lVar7 = lVar7 + 1) {
        pAVar4 = *(Abc_Obj_t **)
                  ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar7]] + 0x40);
        if (pAVar4 == (Abc_Obj_t *)0x0) {
          __assert_fail("pPartNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x3d6,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
        }
        Abc_ObjAddFanin(pAVar5,pAVar4);
      }
      pAVar4 = (Abc_Obj_t *)(pAVar3->field_6).pTemp;
    }
    iVar8 = iVar8 + 1;
  } while (pAVar4 == pAVar5);
  __assert_fail("pObj->pCopy == pPartObj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x3db,"int Abc_FlowRetime_PartialSat(Vec_Ptr_t *, int)");
}

Assistant:

int Abc_FlowRetime_PartialSat(Vec_Ptr_t *vNodes, int cut) {
  Abc_Ntk_t *pPartNtk, *pInitNtk = pManMR->pInitNtk;
  Abc_Obj_t *pObj, *pNext, *pPartObj, *pPartNext, *pPo;
  int i, j, result;

  assert( Abc_NtkPoNum( pInitNtk ) == 1 );

  pPartNtk = Abc_NtkAlloc( pInitNtk->ntkType, pInitNtk->ntkFunc, 0 );

  // copy network
  Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i ) {
    pObj->Level = i;
    assert(!Abc_ObjIsPo( pObj ));

    if (i < cut && !pObj->fMarkA) {
      pPartObj = Abc_NtkCreatePi( pPartNtk );
      Abc_ObjSetCopy( pObj, pPartObj );
    } else {
      // copy node
      pPartObj = Abc_NtkDupObj( pPartNtk, pObj, 0 );
      // copy complementation
      pPartObj->fPhase = pObj->fPhase;
   
      // connect fanins
      Abc_ObjForEachFanin( pObj, pNext, j ) {   
        pPartNext = Abc_ObjCopy( pNext );
        assert(pPartNext);
        Abc_ObjAddFanin( pPartObj, pPartNext );
      }
    }

    assert(pObj->pCopy == pPartObj);
  }
  
  // create PO
  pPo = Abc_NtkCreatePo( pPartNtk );
  pNext = Abc_ObjFanin0( Abc_NtkPo( pInitNtk, 0 ) );
  pPartNext = Abc_ObjCopy( pNext );
  assert( pPartNext );
  Abc_ObjAddFanin( pPo, pPartNext );
  
  // check network
#if defined(DEBUG_CHECK)
  Abc_NtkAddDummyPoNames(pPartNtk);
  Abc_NtkAddDummyPiNames(pPartNtk);
  Abc_NtkCheck( pPartNtk );
#endif

  result = Abc_NtkMiterSat( pPartNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  Abc_NtkDelete( pPartNtk );
 
  return !result;
}